

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestSVN.cxx
# Opt level: O0

void __thiscall cmCTestSVN::ExternalParser::DoPath(ExternalParser *this,string *path)

{
  cmCTestSVN *pcVar1;
  int iVar2;
  ulong uVar3;
  ulong uVar4;
  char *pcVar5;
  char *__s2;
  size_t __n;
  long lVar6;
  long lVar7;
  SVNInfo local_108;
  string local_38 [8];
  string local_path;
  string *path_local;
  ExternalParser *this_local;
  
  local_path.field_2._8_8_ = path;
  std::__cxx11::string::string(local_38);
  uVar3 = std::__cxx11::string::size();
  uVar4 = std::__cxx11::string::size();
  if (uVar4 < uVar3) {
    pcVar5 = (char *)std::__cxx11::string::c_str();
    __s2 = (char *)std::__cxx11::string::c_str();
    __n = std::__cxx11::string::size();
    iVar2 = strncmp(pcVar5,__s2,__n);
    if (iVar2 == 0) {
      lVar6 = std::__cxx11::string::c_str();
      lVar7 = std::__cxx11::string::size();
      std::__cxx11::string::operator=(local_38,(char *)(lVar6 + 1 + lVar7));
      goto LAB_0057e4d6;
    }
  }
  std::__cxx11::string::operator=(local_38,(string *)local_path.field_2._8_8_);
LAB_0057e4d6:
  pcVar1 = this->SVN;
  pcVar5 = (char *)std::__cxx11::string::c_str();
  SVNInfo::SVNInfo(&local_108,pcVar5);
  std::__cxx11::list<cmCTestSVN::SVNInfo,_std::allocator<cmCTestSVN::SVNInfo>_>::push_back
            (&pcVar1->Repositories,&local_108);
  SVNInfo::~SVNInfo(&local_108);
  std::__cxx11::string::~string(local_38);
  return;
}

Assistant:

void DoPath(std::string const& path)
    {
    // Get local path relative to the source directory
    std::string local_path;
    if(path.size() > this->SVN->SourceDirectory.size() &&
       strncmp(path.c_str(), this->SVN->SourceDirectory.c_str(),
               this->SVN->SourceDirectory.size()) == 0)
      {
      local_path = path.c_str() + this->SVN->SourceDirectory.size() + 1;
      }
    else
      {
      local_path = path;
      }
    this->SVN->Repositories.push_back( SVNInfo(local_path.c_str()) );
    }